

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O2

void __thiscall hwnet::TCPSocket::linklist::~linklist(linklist *this)

{
  clear(this);
  return;
}

Assistant:

~linklist(){
			this->clear();
		}